

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O1

void ihevc_sao_edge_offset_class2
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  UWORD8 UVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  UWORD8 *pUVar7;
  int iVar8;
  ulong uVar9;
  UWORD8 *pUVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  byte *pbVar15;
  UWORD8 *pUVar16;
  UWORD8 UVar17;
  UWORD8 au1_mask [64];
  WORD8 au1_sign_up [65];
  UWORD8 au1_src_top_tmp [64];
  UWORD8 au1_src_left_tmp [64];
  WORD8 au1_sign_up_tmp [65];
  UWORD8 *local_1d8;
  byte bStack_189;
  uint local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  UWORD8 local_148 [280];
  
  local_188 = 0xffffffff;
  uStack_184 = 0xffffffff;
  uStack_180 = 0xffffffff;
  uStack_17c = 0xffffffff;
  local_178 = 0xffffffff;
  uStack_174 = 0xffffffff;
  uStack_170 = 0xffffffff;
  uStack_16c = 0xffffffff;
  local_168 = 0xffffffff;
  uStack_164 = 0xffffffff;
  uStack_160 = 0xffffffff;
  uStack_15c = 0xffffffff;
  local_158 = 0xffffffff;
  uStack_154 = 0xffffffff;
  uStack_150 = 0xffffffff;
  uStack_14c = 0xffffffff;
  lVar14 = (long)src_strd;
  if (0 < ht) {
    pUVar7 = pu1_src + (long)wd + -1;
    uVar9 = 0;
    do {
      local_148[uVar9 + 0x90] = *pUVar7;
      uVar9 = uVar9 + 1;
      pUVar7 = pUVar7 + lVar14;
    } while ((uint)ht != uVar9);
  }
  UVar1 = pu1_src_top[(long)wd + -1];
  if (0 < wd) {
    memcpy(local_148 + 0x50,pu1_src + (ht + -1) * src_strd,(ulong)(uint)wd);
  }
  bVar2 = *pu1_src;
  uVar12 = (uint)bVar2;
  if (pu1_avail[4] != '\0') {
    uVar3 = 1;
    if (*pu1_src_top_left <= bVar2) {
      uVar3 = bVar2 == *pu1_src_top_left ^ 3;
    }
    uVar4 = 0xffffffff;
    if (pu1_src[lVar14 + 1] <= bVar2) {
      uVar4 = (uint)(bVar2 != pu1_src[lVar14 + 1]);
    }
    if (uVar4 + uVar3 != 2) {
      uVar3 = (int)pi1_sao_offset[gi4_ihevc_table_edge_idx[uVar4 + uVar3]] + (uint)bVar2;
      uVar12 = 0xff;
      if (((int)uVar3 < 0x100) && (uVar12 = 0, 0 < (int)uVar3)) {
        uVar12 = uVar3;
      }
    }
  }
  iVar6 = ht + -1;
  iVar8 = iVar6 * src_strd + wd + -1;
  bVar2 = pu1_src[iVar8];
  uVar3 = (uint)bVar2;
  if (pu1_avail[7] != '\0') {
    uVar4 = 1;
    if (pu1_src[iVar8 + ~src_strd] <= bVar2) {
      uVar4 = bVar2 == pu1_src[iVar8 + ~src_strd] ^ 3;
    }
    uVar5 = 0xffffffff;
    if (pu1_src[iVar6 * src_strd + wd + src_strd] <= bVar2) {
      uVar5 = (uint)(bVar2 != pu1_src[iVar6 * src_strd + wd + src_strd]);
    }
    if (uVar5 + uVar4 != 2) {
      uVar4 = (int)pi1_sao_offset[gi4_ihevc_table_edge_idx[uVar5 + uVar4]] + (uint)bVar2;
      uVar3 = 0xff;
      if (((int)uVar4 < 0x100) && (uVar3 = 0, 0 < (int)uVar4)) {
        uVar3 = uVar4;
      }
    }
  }
  if (*pu1_avail == '\0') {
    local_188 = local_188 & 0xffffff00;
  }
  if (pu1_avail[2] == '\0') {
    pbVar15 = pu1_src + lVar14;
    local_1d8 = pu1_src_left + 1;
    ht = iVar6;
    if (1 < wd) {
      lVar13 = 0;
      do {
        UVar17 = pu1_src[lVar13 + lVar14 + 1] != pbVar15[(int)lVar13 - src_strd];
        if (pu1_src[lVar13 + lVar14 + 1] < pbVar15[(int)lVar13 - src_strd]) {
          UVar17 = 0xff;
        }
        local_148[lVar13 + 1] = UVar17;
        lVar13 = lVar13 + 1;
      } while ((ulong)(uint)wd - 1 != lVar13);
    }
  }
  else {
    pbVar15 = pu1_src;
    local_1d8 = pu1_src_left;
    if (1 < wd) {
      uVar9 = 1;
      do {
        UVar17 = pu1_src[uVar9] != pu1_src_top[uVar9 - 1];
        if (pu1_src[uVar9] < pu1_src_top[uVar9 - 1]) {
          UVar17 = 0xff;
        }
        local_148[uVar9] = UVar17;
        uVar9 = uVar9 + 1;
      } while ((uint)wd != uVar9);
    }
  }
  if (pu1_avail[1] == '\0') {
    (&bStack_189)[wd] = 0;
  }
  uVar4 = ht - (uint)(pu1_avail[3] == '\0');
  if (0 < (int)uVar4) {
    uVar9 = 0;
    pUVar7 = local_148;
    pUVar16 = local_148 + 0xd0;
    do {
      pUVar10 = pUVar7;
      UVar17 = *pbVar15 != local_1d8[uVar9 - 1];
      if (*pbVar15 < local_1d8[uVar9 - 1]) {
        UVar17 = 0xff;
      }
      *pUVar10 = UVar17;
      if (0 < wd) {
        uVar11 = 0;
        do {
          uVar5 = (uint)(pbVar15[uVar11] != pbVar15[uVar11 + lVar14 + 1]);
          if (pbVar15[uVar11] < pbVar15[uVar11 + lVar14 + 1]) {
            uVar5 = 0xffffffff;
          }
          UVar17 = pUVar10[uVar11];
          pUVar16[uVar11 + 1] = -(char)uVar5;
          uVar5 = (uint)*(byte *)((long)&local_188 + uVar11) &
                  gi4_ihevc_table_edge_idx[(long)(char)UVar17 + (long)(int)uVar5 + 2];
          if (uVar5 != 0) {
            iVar6 = (int)pi1_sao_offset[uVar5] + (uint)pbVar15[uVar11];
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            if (0xfe < iVar6) {
              iVar6 = 0xff;
            }
            pbVar15[uVar11] = (byte)iVar6;
          }
          uVar11 = uVar11 + 1;
        } while ((uint)wd != uVar11);
      }
      pbVar15 = pbVar15 + lVar14;
      uVar9 = uVar9 + 1;
      pUVar7 = pUVar16;
      pUVar16 = pUVar10;
    } while (uVar9 != uVar4);
  }
  uVar5 = uVar4;
  if (pu1_avail[2] == '\0') {
    uVar5 = uVar4 + 1;
  }
  pbVar15[(int)-(uVar5 * src_strd)] = (byte)uVar12;
  iVar6 = 0;
  if (pu1_avail[3] != '\0') {
    iVar6 = src_strd;
  }
  pbVar15[(wd + -1) - iVar6] = (byte)uVar3;
  if (pu1_avail[2] == '\0') {
    uVar4 = uVar4 + 1;
  }
  uVar12 = (uint)(pu1_avail[3] == '\0');
  *pu1_src_top_left = UVar1;
  if (uVar4 + uVar12 != 0 && SCARRY4(uVar4,uVar12) == (int)(uVar4 + uVar12) < 0) {
    memcpy(pu1_src_left,local_148 + 0x90,(ulong)((uVar4 + uVar12) - 1) + 1);
  }
  if (0 < wd) {
    memcpy(pu1_src_top,local_148 + 0x50,(ulong)(uint)wd);
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class2(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[MAX_CTB_SIZE], au1_src_top_tmp[MAX_CTB_SIZE];
    UWORD8 u1_src_top_left_tmp;
    WORD8 au1_sign_up[MAX_CTB_SIZE + 1], au1_sign_up_tmp[MAX_CTB_SIZE + 1];
    WORD8 u1_sign_down;
    WORD8 *pu1_sign_up;
    WORD8 *pu1_sign_up_tmp;
    UWORD8 *pu1_src_left_cpy;

    WORD32 bit_depth;
    UWORD8 u1_pos_0_0_tmp;
    UWORD8 u1_pos_wd_ht_tmp;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);

    bit_depth = BIT_DEPTH_LUMA;
    pu1_sign_up = au1_sign_up;
    pu1_sign_up_tmp = au1_sign_up_tmp;
    pu1_src_left_cpy = pu1_src_left;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    u1_src_top_left_tmp = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }


    /* If top-left is available, process separately */
    if(0 != pu1_avail[4])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[0] - pu1_src_top_left[0]) +
                        SIGN(pu1_src[0] - pu1_src[1 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_0_tmp = CLIP3(pu1_src[0] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_0_tmp = pu1_src[0];
        }
    }
    else
    {
        u1_pos_0_0_tmp = pu1_src[0];
    }

    /* If bottom-right is available, process separately */
    if(0 != pu1_avail[7])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[wd - 1 + (ht - 1) * src_strd] - pu1_src[wd - 1 + (ht - 1) * src_strd - 1 - src_strd]) +
                        SIGN(pu1_src[wd - 1 + (ht - 1) * src_strd] - pu1_src[wd - 1 + (ht - 1) * src_strd + 1 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_ht_tmp = CLIP3(pu1_src[wd - 1 + (ht - 1) * src_strd] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_ht_tmp = pu1_src[wd - 1 + (ht - 1) * src_strd];
        }
    }
    else
    {
        u1_pos_wd_ht_tmp = pu1_src[wd - 1 + (ht - 1) * src_strd];
    }

    /* If Left is not available */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }

    /* If Top is not available */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        pu1_src_left_cpy += 1;
        for(col = 1; col < wd; col++)
        {
            pu1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col - 1 - src_strd]);
        }
    }
    else
    {
        for(col = 1; col < wd; col++)
        {
            pu1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col - 1]);
        }
    }

    /* If Right is not available */
    if(0 == pu1_avail[1])
    {
        au1_mask[wd - 1] = 0;
    }

    /* If Bottom is not available */
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            pu1_sign_up[0] = SIGN(pu1_src[0] - pu1_src_left_cpy[row - 1]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_down = SIGN(pu1_src[col] - pu1_src[col + 1 + src_strd]);
                edge_idx = 2 + pu1_sign_up[col] + u1_sign_down;
                pu1_sign_up_tmp[col + 1] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            /* Swapping pu1_sign_up_tmp and pu1_sign_up */
            {
                WORD8 *pu1_swap_tmp = pu1_sign_up;
                pu1_sign_up = pu1_sign_up_tmp;
                pu1_sign_up_tmp = pu1_swap_tmp;
            }

            pu1_src += src_strd;
        }

        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd] = u1_pos_0_0_tmp;
        pu1_src[(pu1_avail[3] ? wd - 1 - src_strd : wd - 1)] = u1_pos_wd_ht_tmp;
    }

    if(0 == pu1_avail[2])
        ht++;
    if(0 == pu1_avail[3])
        ht++;
    *pu1_src_top_left = u1_src_top_left_tmp;
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}